

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void jmp_dropval(FuncState *fs,BCPos list)

{
  uint uVar1;
  uint uVar2;
  BCInsLine *pBVar3;
  long lVar4;
  
  if (list != 0xffffffff) {
    pBVar3 = fs->bcbase;
    do {
      uVar2 = list - 1;
      if (list == 0) {
        uVar2 = 0;
      }
      uVar1 = pBVar3[uVar2].ins;
      if ((uVar1 & 0xfe) == 0xc) {
        *(byte *)&pBVar3[uVar2].ins = (byte)uVar1 | 2;
        *(undefined1 *)((long)&pBVar3[uVar2].ins + 1) = 0;
        pBVar3 = fs->bcbase;
      }
      else if ((~uVar1 & 0xff00) == 0) {
        pBVar3[uVar2].ins = (uint)*(byte *)((long)&pBVar3[list].ins + 1) << 8 | 0x80000058;
      }
      lVar4 = (ulong)*(ushort *)((long)&pBVar3[list].ins + 2) - 0x8000;
    } while ((lVar4 != -1) && (list = list + (int)lVar4 + 1, list != 0xffffffff));
  }
  return;
}

Assistant:

static void jmp_dropval(FuncState *fs, BCPos list)
{
  for (; list != NO_JMP; list = jmp_next(fs, list))
    jmp_patchtestreg(fs, list, NO_REG);
}